

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_stroke_rect(nk_command_buffer *b,nk_rect rect,float rounding,float line_thickness,nk_color c
                   )

{
  float fVar1;
  void *pvVar2;
  float fVar3;
  float fVar7;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar8;
  float fVar10;
  undefined1 auVar9 [16];
  float in_XMM2_Db;
  float in_XMM3_Db;
  float fStack_20;
  float fStack_1c;
  
  if (b == (nk_command_buffer *)0x0) {
    __assert_fail("b",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x1819,
                  "void nk_stroke_rect(struct nk_command_buffer *, struct nk_rect, float, float, struct nk_color)"
                 );
  }
  if (0xffffff < (uint)c) {
    fVar8 = rect.w;
    if ((fVar8 != 0.0) || (NAN(fVar8))) {
      fVar10 = rect.h;
      if ((fVar10 != 0.0) || (NAN(fVar10))) {
        fVar3 = rect.x;
        fVar7 = rect.y;
        if (b->use_clipping != 0) {
          fVar1 = (b->clip).x;
          if (fVar3 + fVar8 < fVar1) {
            return;
          }
          if (fVar1 + (b->clip).w < fVar3) {
            return;
          }
          fVar8 = (b->clip).y;
          if (fVar10 + fVar7 < fVar8) {
            return;
          }
          if (fVar8 + (b->clip).h < fVar7) {
            return;
          }
        }
        pvVar2 = nk_command_buffer_push(b,NK_COMMAND_RECT,0x20);
        fStack_20 = rect.x;
        fStack_1c = rect.y;
        auVar9._8_8_ = rect._8_8_;
        auVar9._0_8_ = rect._8_8_;
        if (pvVar2 != (void *)0x0) {
          auVar4._0_4_ = (int)rounding;
          auVar4._4_4_ = (int)line_thickness;
          auVar4._8_4_ = (int)in_XMM2_Db;
          auVar4._12_4_ = (int)in_XMM3_Db;
          auVar4 = pshuflw(auVar4,auVar4,0xe8);
          *(int *)((long)pvVar2 + 0x10) = auVar4._0_4_;
          auVar5._0_4_ = (int)fVar3;
          auVar5._4_4_ = (int)fVar7;
          auVar5._8_4_ = (int)fStack_20;
          auVar5._12_4_ = (int)fStack_1c;
          auVar4 = pshuflw(auVar5,auVar5,0xe8);
          *(int *)((long)pvVar2 + 0x14) = auVar4._0_4_;
          auVar9 = maxps(auVar9,(undefined1  [16])0x0);
          auVar6._0_4_ = (int)auVar9._0_4_;
          auVar6._4_4_ = (int)auVar9._4_4_;
          auVar6._8_4_ = (int)auVar9._8_4_;
          auVar6._12_4_ = (int)auVar9._12_4_;
          auVar9 = pshuflw(auVar6,auVar6,0xe8);
          *(int *)((long)pvVar2 + 0x18) = auVar9._0_4_;
          *(short *)((long)pvVar2 + 0x1c) = c._0_2_;
          *(nk_byte *)((long)pvVar2 + 0x1e) = c.b;
          *(nk_byte *)((long)pvVar2 + 0x1f) = c.a;
        }
      }
    }
  }
  return;
}

Assistant:

NK_API void
nk_stroke_rect(struct nk_command_buffer *b, struct nk_rect rect,
    float rounding, float line_thickness, struct nk_color c)
{
    struct nk_command_rect *cmd;
    NK_ASSERT(b);
    if (!b || c.a == 0 || rect.w == 0 || rect.h == 0) return;
    if (b->use_clipping) {
        const struct nk_rect *clip = &b->clip;
        if (!NK_INTERSECT(rect.x, rect.y, rect.w, rect.h,
            clip->x, clip->y, clip->w, clip->h)) return;
    }

    cmd = (struct nk_command_rect*)
        nk_command_buffer_push(b, NK_COMMAND_RECT, sizeof(*cmd));
    if (!cmd) return;
    cmd->rounding = (unsigned short)rounding;
    cmd->line_thickness = (unsigned short)line_thickness;
    cmd->x = (short)rect.x;
    cmd->y = (short)rect.y;
    cmd->w = (unsigned short)NK_MAX(0, rect.w);
    cmd->h = (unsigned short)NK_MAX(0, rect.h);
    cmd->color = c;
}